

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int GetCharConstInApostrophes(char **op,aint *val)

{
  char *pcVar1;
  aint *val_local;
  char **op_local;
  
  if ((**op == '\'') && ((*op)[1] == '\'')) {
    *val = 0x27;
    *op = *op + 2;
    op_local._4_4_ = 1;
  }
  else if ((**op == '\'') || (**op == '\0')) {
    op_local._4_4_ = 0;
  }
  else {
    pcVar1 = *op;
    *op = pcVar1 + 1;
    *val = (int)*pcVar1;
    op_local._4_4_ = 1;
  }
  return op_local._4_4_;
}

Assistant:

int GetCharConstInApostrophes(char*& op, aint& val) {
	if ('\'' == op[0] && '\'' == op[1]) {	// '' converts to actual apostrophe as value
		val = '\'';
		op += 2;
		return 1;
	}
	if ('\'' == *op || !*op) return 0;		// closing apostrophe or no more characters, return 0
	// normal character, just return it
	val = *op++;
	return 1;
}